

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::restore_clip(Fl_Graphics_Driver *this)

{
  this->fl_clip_state_number = this->fl_clip_state_number + 1;
  if (fl_gc == (GC)0x0) {
    return;
  }
  if (this->rstack[this->rstackptr] == (Fl_Region)0x0) {
    XSetClipMask(fl_display,fl_gc,0);
    return;
  }
  XSetRegion(fl_display);
  return;
}

Assistant:

void Fl_Graphics_Driver::restore_clip() {
  fl_clip_state_number++;
  if (!fl_gc) return;
  Fl_Region r = rstack[rstackptr];
#if defined(USE_X11)
  if (r) XSetRegion(fl_display, fl_gc, r);
  else XSetClipMask(fl_display, fl_gc, 0);
#elif defined(WIN32)
  SelectClipRgn(fl_gc, r); //if r is NULL, clip is automatically cleared
#elif defined(__APPLE_QUARTZ__)
  if ( fl_window || fl_gc ) { // clipping for a true window or an offscreen buffer
    Fl_X::q_clear_clipping();
    Fl_X::q_fill_context();//flip coords if bitmap context
    //apply program clip
    if (r) {
      CGContextClipToRects(fl_gc, r->rects, r->count);
    }
  }
#else
# error unsupported platform
#endif
}